

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000002ed1b0 = 0x2d2d2d2d2d2d2d;
    uRam00000000002ed1b7._0_1_ = '-';
    uRam00000000002ed1b7._1_1_ = '-';
    uRam00000000002ed1b7._2_1_ = '-';
    uRam00000000002ed1b7._3_1_ = '-';
    uRam00000000002ed1b7._4_1_ = '-';
    uRam00000000002ed1b7._5_1_ = '-';
    uRam00000000002ed1b7._6_1_ = '-';
    uRam00000000002ed1b7._7_1_ = '-';
    DAT_002ed1a0 = '-';
    DAT_002ed1a0_1._0_1_ = '-';
    DAT_002ed1a0_1._1_1_ = '-';
    DAT_002ed1a0_1._2_1_ = '-';
    DAT_002ed1a0_1._3_1_ = '-';
    DAT_002ed1a0_1._4_1_ = '-';
    DAT_002ed1a0_1._5_1_ = '-';
    DAT_002ed1a0_1._6_1_ = '-';
    uRam00000000002ed1a8 = 0x2d2d2d2d2d2d2d;
    DAT_002ed1af = 0x2d;
    DAT_002ed190 = '-';
    DAT_002ed190_1._0_1_ = '-';
    DAT_002ed190_1._1_1_ = '-';
    DAT_002ed190_1._2_1_ = '-';
    DAT_002ed190_1._3_1_ = '-';
    DAT_002ed190_1._4_1_ = '-';
    DAT_002ed190_1._5_1_ = '-';
    DAT_002ed190_1._6_1_ = '-';
    uRam00000000002ed198._0_1_ = '-';
    uRam00000000002ed198._1_1_ = '-';
    uRam00000000002ed198._2_1_ = '-';
    uRam00000000002ed198._3_1_ = '-';
    uRam00000000002ed198._4_1_ = '-';
    uRam00000000002ed198._5_1_ = '-';
    uRam00000000002ed198._6_1_ = '-';
    uRam00000000002ed198._7_1_ = '-';
    DAT_002ed180 = '-';
    DAT_002ed180_1._0_1_ = '-';
    DAT_002ed180_1._1_1_ = '-';
    DAT_002ed180_1._2_1_ = '-';
    DAT_002ed180_1._3_1_ = '-';
    DAT_002ed180_1._4_1_ = '-';
    DAT_002ed180_1._5_1_ = '-';
    DAT_002ed180_1._6_1_ = '-';
    uRam00000000002ed188._0_1_ = '-';
    uRam00000000002ed188._1_1_ = '-';
    uRam00000000002ed188._2_1_ = '-';
    uRam00000000002ed188._3_1_ = '-';
    uRam00000000002ed188._4_1_ = '-';
    uRam00000000002ed188._5_1_ = '-';
    uRam00000000002ed188._6_1_ = '-';
    uRam00000000002ed188._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000002ed178._0_1_ = '-';
    uRam00000000002ed178._1_1_ = '-';
    uRam00000000002ed178._2_1_ = '-';
    uRam00000000002ed178._3_1_ = '-';
    uRam00000000002ed178._4_1_ = '-';
    uRam00000000002ed178._5_1_ = '-';
    uRam00000000002ed178._6_1_ = '-';
    uRam00000000002ed178._7_1_ = '-';
    DAT_002ed1bf = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}